

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qintc.cc
# Opt level: O2

void try_range_check_real<long_long>(char *description,bool exp_pass,longlong *a,longlong *b)

{
  ostream *poVar1;
  char *pcVar2;
  
  QIntC::range_check<long_long>(a,b);
  poVar1 = std::operator<<((ostream *)&std::cout,description);
  std::operator<<(poVar1,": okay");
  pcVar2 = " FAILED";
  if (exp_pass) {
    pcVar2 = " PASSED";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

static void
try_range_check_real(char const* description, bool exp_pass, T const& a, T const& b)
{
    bool passed = false;
    try {
        QIntC::range_check(a, b);
        std::cout << description << ": okay";
        passed = true;
    } catch (std::range_error& e) {
        std::cout << description << ": " << e.what();
        passed = false;
    }
    std::cout << ((passed == exp_pass) ? " PASSED" : " FAILED") << std::endl;
}